

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O1

void bio_verify_chksum(FILE *fp,int32 byteswap,uint32 chksum)

{
  undefined8 in_RAX;
  size_t sVar1;
  uint32 file_chksum;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  sVar1 = fread((void *)((long)&uStack_18 + 4),4,1,(FILE *)fp);
  if (sVar1 == 1) {
    if (byteswap != 0) {
      uStack_18 = CONCAT44(uStack_18._4_4_ >> 0x18 | (uStack_18._4_4_ & 0xff0000) >> 8 |
                           (uStack_18._4_4_ & 0xff00) << 8 | uStack_18._4_4_ << 0x18,
                           (undefined4)uStack_18);
    }
    if (uStack_18._4_4_ == chksum) {
      return;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
            ,0x1f7,"Checksum error; file-checksum %08x, computed %08x\n",(ulong)uStack_18._4_4_,
            (ulong)chksum);
  }
  else {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
            ,0x1f1,"fread(chksum) failed\n");
  }
  exit(1);
}

Assistant:

void
bio_verify_chksum(FILE * fp, int32 byteswap, uint32 chksum)
{
    uint32 file_chksum;

    if (fread(&file_chksum, sizeof(uint32), 1, fp) != 1)
        E_FATAL("fread(chksum) failed\n");
    if (byteswap)
        SWAP_INT32(&file_chksum);
    if (file_chksum != chksum)
        E_FATAL
            ("Checksum error; file-checksum %08x, computed %08x\n",
             file_chksum, chksum);
}